

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::extractLaneI64x2(Literal *__return_storage_ptr__,Literal *this,uint8_t index)

{
  reference other;
  LaneArray<2> local_50;
  byte local_19;
  Literal *pLStack_18;
  uint8_t index_local;
  Literal *this_local;
  
  local_19 = index;
  pLStack_18 = this;
  this_local = __return_storage_ptr__;
  getLanesI64x2(&local_50,this);
  other = std::array<wasm::Literal,_2UL>::at(&local_50,(ulong)local_19);
  Literal(__return_storage_ptr__,other);
  std::array<wasm::Literal,_2UL>::~array(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::extractLaneI64x2(uint8_t index) const {
  return getLanesI64x2().at(index);
}